

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugger.cpp
# Opt level: O1

void __thiscall breakpoint_recorder::reset(breakpoint_recorder *this)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  pointer pcVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined1 auVar14 [11];
  undefined1 auVar15 [11];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  char *pcVar22;
  uint uVar23;
  forward_list<breakpoint_recorder::breakpoint,_std::allocator<breakpoint_recorder::breakpoint>_>
  *__range2;
  breakpoint_recorder *pbVar24;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>
  *it;
  slot_type *psVar25;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  
  pcVar2 = (this->m_pending).
           super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
           .
           super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
           .ctrl_;
  psVar25 = (this->m_pending).
            super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
            .
            super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
            .slots_;
  cVar1 = *pcVar2;
  pcVar22 = pcVar2;
  while (cVar1 < -1) {
    iVar10 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                    CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    iVar11 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                    CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    iVar12 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                    CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    iVar13 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                    CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Ba = -(*pcVar22 < (char)iVar10);
    in_XMM1_Bb = -(pcVar22[1] < (char)((uint)iVar10 >> 8));
    in_XMM1_Bc = -(pcVar22[2] < (char)((uint)iVar10 >> 0x10));
    in_XMM1_Bd = -(pcVar22[3] < (char)((uint)iVar10 >> 0x18));
    in_XMM1_Be = -(pcVar22[4] < (char)iVar11);
    in_XMM1_Bf = -(pcVar22[5] < (char)((uint)iVar11 >> 8));
    in_XMM1_Bg = -(pcVar22[6] < (char)((uint)iVar11 >> 0x10));
    in_XMM1_Bh = -(pcVar22[7] < (char)((uint)iVar11 >> 0x18));
    in_XMM1_Bi = -(pcVar22[8] < (char)iVar12);
    in_XMM1_Bj = -(pcVar22[9] < (char)((uint)iVar12 >> 8));
    in_XMM1_Bk = -(pcVar22[10] < (char)((uint)iVar12 >> 0x10));
    in_XMM1_Bl = -(pcVar22[0xb] < (char)((uint)iVar12 >> 0x18));
    in_XMM1_Bm = -(pcVar22[0xc] < (char)iVar13);
    in_XMM1_Bn = -(pcVar22[0xd] < (char)((uint)iVar13 >> 8));
    in_XMM1_Bo = -(pcVar22[0xe] < (char)((uint)iVar13 >> 0x10));
    in_XMM1_Bp = -(pcVar22[0xf] < (char)((uint)iVar13 >> 0x18));
    auVar6[1] = in_XMM1_Bb;
    auVar6[0] = in_XMM1_Ba;
    auVar6[2] = in_XMM1_Bc;
    auVar6[3] = in_XMM1_Bd;
    auVar6[4] = in_XMM1_Be;
    auVar6[5] = in_XMM1_Bf;
    auVar6[6] = in_XMM1_Bg;
    auVar6[7] = in_XMM1_Bh;
    auVar6[8] = in_XMM1_Bi;
    auVar6[9] = in_XMM1_Bj;
    auVar6[10] = in_XMM1_Bk;
    auVar6[0xb] = in_XMM1_Bl;
    auVar6[0xc] = in_XMM1_Bm;
    auVar6[0xd] = in_XMM1_Bn;
    auVar6[0xe] = in_XMM1_Bo;
    auVar6[0xf] = in_XMM1_Bp;
    auVar7[1] = in_XMM1_Bb;
    auVar7[0] = in_XMM1_Ba;
    auVar7[2] = in_XMM1_Bc;
    auVar7[3] = in_XMM1_Bd;
    auVar7[4] = in_XMM1_Be;
    auVar7[5] = in_XMM1_Bf;
    auVar7[6] = in_XMM1_Bg;
    auVar7[7] = in_XMM1_Bh;
    auVar7[8] = in_XMM1_Bi;
    auVar7[9] = in_XMM1_Bj;
    auVar7[10] = in_XMM1_Bk;
    auVar7[0xb] = in_XMM1_Bl;
    auVar7[0xc] = in_XMM1_Bm;
    auVar7[0xd] = in_XMM1_Bn;
    auVar7[0xe] = in_XMM1_Bo;
    auVar7[0xf] = in_XMM1_Bp;
    auVar20[1] = in_XMM1_Bd;
    auVar20[0] = in_XMM1_Bc;
    auVar20[2] = in_XMM1_Be;
    auVar20[3] = in_XMM1_Bf;
    auVar20[4] = in_XMM1_Bg;
    auVar20[5] = in_XMM1_Bh;
    auVar20[6] = in_XMM1_Bi;
    auVar20[7] = in_XMM1_Bj;
    auVar20[8] = in_XMM1_Bk;
    auVar20[9] = in_XMM1_Bl;
    auVar20[10] = in_XMM1_Bm;
    auVar20[0xb] = in_XMM1_Bn;
    auVar20[0xc] = in_XMM1_Bo;
    auVar20[0xd] = in_XMM1_Bp;
    auVar18[1] = in_XMM1_Be;
    auVar18[0] = in_XMM1_Bd;
    auVar18[2] = in_XMM1_Bf;
    auVar18[3] = in_XMM1_Bg;
    auVar18[4] = in_XMM1_Bh;
    auVar18[5] = in_XMM1_Bi;
    auVar18[6] = in_XMM1_Bj;
    auVar18[7] = in_XMM1_Bk;
    auVar18[8] = in_XMM1_Bl;
    auVar18[9] = in_XMM1_Bm;
    auVar18[10] = in_XMM1_Bn;
    auVar18[0xb] = in_XMM1_Bo;
    auVar18[0xc] = in_XMM1_Bp;
    auVar16[1] = in_XMM1_Bf;
    auVar16[0] = in_XMM1_Be;
    auVar16[2] = in_XMM1_Bg;
    auVar16[3] = in_XMM1_Bh;
    auVar16[4] = in_XMM1_Bi;
    auVar16[5] = in_XMM1_Bj;
    auVar16[6] = in_XMM1_Bk;
    auVar16[7] = in_XMM1_Bl;
    auVar16[8] = in_XMM1_Bm;
    auVar16[9] = in_XMM1_Bn;
    auVar16[10] = in_XMM1_Bo;
    auVar16[0xb] = in_XMM1_Bp;
    auVar14[1] = in_XMM1_Bg;
    auVar14[0] = in_XMM1_Bf;
    auVar14[2] = in_XMM1_Bh;
    auVar14[3] = in_XMM1_Bi;
    auVar14[4] = in_XMM1_Bj;
    auVar14[5] = in_XMM1_Bk;
    auVar14[6] = in_XMM1_Bl;
    auVar14[7] = in_XMM1_Bm;
    auVar14[8] = in_XMM1_Bn;
    auVar14[9] = in_XMM1_Bo;
    auVar14[10] = in_XMM1_Bp;
    uVar23 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar20 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar18 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar16 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar14 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                               CONCAT18(in_XMM1_Bo,
                                                        CONCAT17(in_XMM1_Bn,
                                                                 CONCAT16(in_XMM1_Bm,
                                                                          CONCAT15(in_XMM1_Bl,
                                                                                   CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                               CONCAT17(in_XMM1_Bo,
                                                        CONCAT16(in_XMM1_Bn,
                                                                 CONCAT15(in_XMM1_Bm,
                                                                          CONCAT14(in_XMM1_Bl,
                                                                                   CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                     7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
    uVar5 = 0;
    if (uVar23 != 0) {
      for (; (uVar23 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
      }
    }
    psVar25 = (slot_type *)((long)psVar25 + (ulong)(uVar5 * 0x30));
    cVar1 = pcVar22[uVar5];
    pcVar22 = pcVar22 + uVar5;
  }
  sVar3 = (this->m_pending).
          super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
          .
          super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
          .capacity_;
  do {
    if (pcVar22 == pcVar2 + sVar3) {
      return;
    }
    (psVar25->value).second.second = true;
    pbVar24 = this;
    do {
      pbVar24 = *(breakpoint_recorder **)&pbVar24->m_breakpoints;
      if (pbVar24 == (breakpoint_recorder *)0x0) goto LAB_00126bf8;
    } while (*(unsigned_long *)
              &(pbVar24->m_pending).
               super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
             != (psVar25->value).second.first);
    (**(code **)(**(long **)&pbVar24[1].m_breakpoints + 0x10))();
    *(undefined ***)((long)&pbVar24->m_pending + 8) = &PTR_get_type_0025d9b0;
    *(undefined1 **)((long)&pbVar24->m_pending + 0x10) =
         (undefined1 *)((long)&pbVar24->m_pending + 0x20);
    pcVar4 = (psVar25->value).first._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&pbVar24->m_pending + 0x10),pcVar4,
               pcVar4 + (psVar25->key)._M_string_length);
LAB_00126bf8:
    psVar25 = psVar25 + 1;
    cVar1 = pcVar22[1];
    pcVar22 = pcVar22 + 1;
    while (cVar1 < -1) {
      iVar10 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                      CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar11 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                      CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar12 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                      CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar13 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                      CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar22 < (char)iVar10);
      in_XMM1_Bb = -(pcVar22[1] < (char)((uint)iVar10 >> 8));
      in_XMM1_Bc = -(pcVar22[2] < (char)((uint)iVar10 >> 0x10));
      in_XMM1_Bd = -(pcVar22[3] < (char)((uint)iVar10 >> 0x18));
      in_XMM1_Be = -(pcVar22[4] < (char)iVar11);
      in_XMM1_Bf = -(pcVar22[5] < (char)((uint)iVar11 >> 8));
      in_XMM1_Bg = -(pcVar22[6] < (char)((uint)iVar11 >> 0x10));
      in_XMM1_Bh = -(pcVar22[7] < (char)((uint)iVar11 >> 0x18));
      in_XMM1_Bi = -(pcVar22[8] < (char)iVar12);
      in_XMM1_Bj = -(pcVar22[9] < (char)((uint)iVar12 >> 8));
      in_XMM1_Bk = -(pcVar22[10] < (char)((uint)iVar12 >> 0x10));
      in_XMM1_Bl = -(pcVar22[0xb] < (char)((uint)iVar12 >> 0x18));
      in_XMM1_Bm = -(pcVar22[0xc] < (char)iVar13);
      in_XMM1_Bn = -(pcVar22[0xd] < (char)((uint)iVar13 >> 8));
      in_XMM1_Bo = -(pcVar22[0xe] < (char)((uint)iVar13 >> 0x10));
      in_XMM1_Bp = -(pcVar22[0xf] < (char)((uint)iVar13 >> 0x18));
      auVar8[1] = in_XMM1_Bb;
      auVar8[0] = in_XMM1_Ba;
      auVar8[2] = in_XMM1_Bc;
      auVar8[3] = in_XMM1_Bd;
      auVar8[4] = in_XMM1_Be;
      auVar8[5] = in_XMM1_Bf;
      auVar8[6] = in_XMM1_Bg;
      auVar8[7] = in_XMM1_Bh;
      auVar8[8] = in_XMM1_Bi;
      auVar8[9] = in_XMM1_Bj;
      auVar8[10] = in_XMM1_Bk;
      auVar8[0xb] = in_XMM1_Bl;
      auVar8[0xc] = in_XMM1_Bm;
      auVar8[0xd] = in_XMM1_Bn;
      auVar8[0xe] = in_XMM1_Bo;
      auVar8[0xf] = in_XMM1_Bp;
      auVar9[1] = in_XMM1_Bb;
      auVar9[0] = in_XMM1_Ba;
      auVar9[2] = in_XMM1_Bc;
      auVar9[3] = in_XMM1_Bd;
      auVar9[4] = in_XMM1_Be;
      auVar9[5] = in_XMM1_Bf;
      auVar9[6] = in_XMM1_Bg;
      auVar9[7] = in_XMM1_Bh;
      auVar9[8] = in_XMM1_Bi;
      auVar9[9] = in_XMM1_Bj;
      auVar9[10] = in_XMM1_Bk;
      auVar9[0xb] = in_XMM1_Bl;
      auVar9[0xc] = in_XMM1_Bm;
      auVar9[0xd] = in_XMM1_Bn;
      auVar9[0xe] = in_XMM1_Bo;
      auVar9[0xf] = in_XMM1_Bp;
      auVar21[1] = in_XMM1_Bd;
      auVar21[0] = in_XMM1_Bc;
      auVar21[2] = in_XMM1_Be;
      auVar21[3] = in_XMM1_Bf;
      auVar21[4] = in_XMM1_Bg;
      auVar21[5] = in_XMM1_Bh;
      auVar21[6] = in_XMM1_Bi;
      auVar21[7] = in_XMM1_Bj;
      auVar21[8] = in_XMM1_Bk;
      auVar21[9] = in_XMM1_Bl;
      auVar21[10] = in_XMM1_Bm;
      auVar21[0xb] = in_XMM1_Bn;
      auVar21[0xc] = in_XMM1_Bo;
      auVar21[0xd] = in_XMM1_Bp;
      auVar19[1] = in_XMM1_Be;
      auVar19[0] = in_XMM1_Bd;
      auVar19[2] = in_XMM1_Bf;
      auVar19[3] = in_XMM1_Bg;
      auVar19[4] = in_XMM1_Bh;
      auVar19[5] = in_XMM1_Bi;
      auVar19[6] = in_XMM1_Bj;
      auVar19[7] = in_XMM1_Bk;
      auVar19[8] = in_XMM1_Bl;
      auVar19[9] = in_XMM1_Bm;
      auVar19[10] = in_XMM1_Bn;
      auVar19[0xb] = in_XMM1_Bo;
      auVar19[0xc] = in_XMM1_Bp;
      auVar17[1] = in_XMM1_Bf;
      auVar17[0] = in_XMM1_Be;
      auVar17[2] = in_XMM1_Bg;
      auVar17[3] = in_XMM1_Bh;
      auVar17[4] = in_XMM1_Bi;
      auVar17[5] = in_XMM1_Bj;
      auVar17[6] = in_XMM1_Bk;
      auVar17[7] = in_XMM1_Bl;
      auVar17[8] = in_XMM1_Bm;
      auVar17[9] = in_XMM1_Bn;
      auVar17[10] = in_XMM1_Bo;
      auVar17[0xb] = in_XMM1_Bp;
      auVar15[1] = in_XMM1_Bg;
      auVar15[0] = in_XMM1_Bf;
      auVar15[2] = in_XMM1_Bh;
      auVar15[3] = in_XMM1_Bi;
      auVar15[4] = in_XMM1_Bj;
      auVar15[5] = in_XMM1_Bk;
      auVar15[6] = in_XMM1_Bl;
      auVar15[7] = in_XMM1_Bm;
      auVar15[8] = in_XMM1_Bn;
      auVar15[9] = in_XMM1_Bo;
      auVar15[10] = in_XMM1_Bp;
      uVar23 = (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar21 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar19 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar17 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar15 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar5 = 0;
      if (uVar23 != 0) {
        for (; (uVar23 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      psVar25 = (slot_type *)((long)psVar25 + (ulong)(uVar5 * 0x30));
      cVar1 = pcVar22[uVar5];
      pcVar22 = pcVar22 + uVar5;
    }
  } while( true );
}

Assistant:

void reset()
	{
		for (auto &it: m_pending) {
			it.second.second = true;
			for (auto &b: m_breakpoints) {
				if (b.id == it.second.first) {
					b.data.emplace<std::string>(it.first);
					break;
				}
			}
		}
	}